

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_modinv64_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  code *pcVar5;
  ushort *in_RDX;
  long in_RSI;
  uint16_t negone [16];
  uint16_t sqr [16];
  int jac;
  int nonzero;
  int vartime;
  int i;
  secp256k1_modinv64_modinfo m;
  secp256k1_modinv64_signed62 x;
  uint16_t tmp [16];
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  short in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff1a;
  uint16_t *in_stack_ffffffffffffff20;
  uint16_t *in_stack_ffffffffffffff28;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffff30;
  int local_98;
  int local_94;
  long local_90 [5];
  ulong local_68;
  long local_60;
  long local_58;
  secp256k1_modinv64_modinfo *in_stack_ffffffffffffffb0;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffb8;
  long local_40;
  ushort in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffca;
  uint16_t *in_stack_ffffffffffffffd0;
  uint16_t *in_stack_ffffffffffffffd8;
  uint16_t *in_stack_ffffffffffffffe0;
  
  uint16_to_signed62(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  uVar1 = (ushort)((((local_60 != 0 || local_58 != 0) ||
                    in_stack_ffffffffffffffb0 != (secp256k1_modinv64_modinfo *)0x0) ||
                   in_stack_ffffffffffffffb8 != (secp256k1_modinv64_signed62 *)0x0) || local_40 != 0
                  );
  uint16_to_signed62(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  uVar4 = modinv2p64(CONCAT17(in_stack_ffffffffffffff17,
                              CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  local_68 = uVar4 & 0x3fffffffffffffff;
  if ((local_68 * local_90[0] & 0x3fffffffffffffff) != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x3cd,"test condition failed: ((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1");
    abort();
  }
  if (uVar1 != 0) {
    mulmod256(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
              (uint16_t *)CONCAT62(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8));
    uint16_to_signed62(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    uVar2 = secp256k1_jacobi64_maybe_var(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffff17 = uVar2 < 2;
    if (!(bool)in_stack_ffffffffffffff17) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x3d7,"test condition failed: jac == 0 || jac == 1");
      abort();
    }
    in_stack_ffffffffffffff18 = *in_RDX - 1;
    for (local_94 = 1; local_94 < 0x10; local_94 = local_94 + 1) {
      *(ushort *)(&stack0xffffffffffffff18 + (long)local_94 * 2) = in_RDX[local_94];
    }
    mulmod256(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
              (uint16_t *)CONCAT62(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8));
    uint16_to_signed62(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    iVar3 = secp256k1_jacobi64_maybe_var(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffff16 = true;
    if (iVar3 != 0) {
      in_stack_ffffffffffffff16 = iVar3 == 1 - (*in_RDX & 2);
    }
    if (((in_stack_ffffffffffffff16 ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x3df,"test condition failed: jac == 0 || jac == 1 - (mod[0] & 2)");
      abort();
    }
  }
  uint16_to_signed62(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  mutate_sign_signed62
            ((secp256k1_modinv64_signed62 *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  local_98 = 0;
  while( true ) {
    if (1 < local_98) {
      return;
    }
    pcVar5 = secp256k1_modinv64;
    if (local_98 != 0) {
      pcVar5 = secp256k1_modinv64_var;
    }
    (*pcVar5)(&local_60,local_90);
    signed62_to_uint16(in_stack_ffffffffffffff20,
                       (secp256k1_modinv64_signed62 *)
                       CONCAT62(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18));
    mulmod256(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
              (uint16_t *)CONCAT62(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8));
    if (in_stack_ffffffffffffffc8 != uVar1) break;
    for (local_94 = 1; local_94 < 0x10; local_94 = local_94 + 1) {
      if (*(short *)(&stack0xffffffffffffffc8 + (long)local_94 * 2) != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x3ee,"test condition failed: tmp[i] == 0");
        abort();
      }
    }
    pcVar5 = secp256k1_modinv64;
    if (local_98 != 0) {
      pcVar5 = secp256k1_modinv64_var;
    }
    (*pcVar5)(&local_60,local_90);
    signed62_to_uint16(in_stack_ffffffffffffff20,
                       (secp256k1_modinv64_signed62 *)
                       CONCAT62(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18));
    for (local_94 = 0; local_94 < 0x10; local_94 = local_94 + 1) {
      if (*(short *)(&stack0xffffffffffffffc8 + (long)local_94 * 2) !=
          *(short *)(in_RSI + (long)local_94 * 2)) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x3f5,"test condition failed: tmp[i] == in[i]");
        abort();
      }
    }
    local_98 = local_98 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x3ed,"test condition failed: tmp[0] == nonzero");
  abort();
}

Assistant:

static void test_modinv64_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    static const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    uint16_t tmp[16];
    secp256k1_modinv64_signed62 x;
    secp256k1_modinv64_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed62(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4]) != 0;
    uint16_to_signed62(&m.modulus, mod);

    /* compute 1/modulus mod 2^62 */
    m.modulus_inv62 = modinv2p64(m.modulus.v[0]) & M62;
    CHECK(((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1);

    /* Test secp256k1_jacobi64_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed62(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed62(&x, sqr);
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed62(&x, in);
    mutate_sign_signed62(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* produce output */
        signed62_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* check if the result is equal to the input */
        signed62_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}